

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isofile_gen_utility_names(archive_write *a,isofile *file)

{
  ulong uVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_string_conv *paVar4;
  int *piVar5;
  char *pcVar6;
  archive_string *paVar7;
  char *pcVar8;
  size_t sVar9;
  void *_p;
  size_t local_f0;
  size_t local_d8;
  size_t local_a0;
  char *local_88;
  char *rp;
  size_t ll;
  size_t ulen_last;
  size_t u16len;
  char *ulast;
  char *u16;
  ulong uStack_50;
  int ret;
  size_t len;
  char *slash;
  char *dirname;
  char *p;
  char *pathname;
  iso9660_conflict *iso9660;
  isofile *file_local;
  archive_write *a_local;
  
  u16._4_4_ = 0;
  pathname = (char *)a->format_data;
  (file->parentdir).length = 0;
  (file->basename).length = 0;
  (file->basename_utf16).length = 0;
  (file->symlink).length = 0;
  iso9660 = (iso9660_conflict *)file;
  file_local = (isofile *)a;
  p = archive_entry_pathname(file->entry);
  if ((p == (char *)0x0) || (*p == '\0')) {
    *(undefined4 *)&(iso9660->all_file_list).first = 0;
    return u16._4_4_;
  }
  if ((*(uint *)(pathname + 0x10370) >> 0x11 & 3) != 0) {
    if (*(long *)(pathname + 0x78) == 0) {
      paVar4 = archive_string_conversion_to_charset((archive *)file_local,"UTF-16BE",L'\x01');
      *(archive_string_conv **)(pathname + 0x78) = paVar4;
      if (*(long *)(pathname + 0x78) == 0) {
        return -0x1e;
      }
      paVar4 = archive_string_conversion_from_charset((archive *)file_local,"UTF-16BE",L'\x01');
      *(archive_string_conv **)(pathname + 0x80) = paVar4;
      if (*(long *)(pathname + 0x80) == 0) {
        return -0x1e;
      }
    }
    wVar2 = _archive_entry_pathname_l
                      ((archive_entry *)(iso9660->cur_dirstr).s,&ulast,&ulen_last,
                       *(archive_string_conv **)(pathname + 0x78));
    if (wVar2 < L'\0') {
      piVar5 = __errno_location();
      if (*piVar5 == 0xc) {
        archive_set_error((archive *)file_local,0xc,"Can\'t allocate memory for UTF-16BE");
        return -0x1e;
      }
      archive_set_error((archive *)file_local,-1,
                        "A filename cannot be converted to UTF-16BE;You should disable making Joliet extension"
                       );
      u16._4_4_ = -0x14;
    }
    for (; ((1 < ulen_last && (ulast[ulen_last - 2] == '\0')) && (ulast[ulen_last - 1] == '/'));
        ulen_last = ulen_last - 2) {
    }
    u16len = (size_t)ulast;
    ll = ulen_last >> 1;
    for (ulen_last = ll; ulen_last != 0; ulen_last = ulen_last - 1) {
      if ((*ulast == '\0') && (ulast[1] == '/')) {
        u16len = (size_t)(ulast + 2);
        ll = ulen_last - 1;
      }
      ulast = ulast + 2;
    }
    pcVar6 = (char *)(ll << 1);
    paVar7 = archive_string_ensure
                       ((archive_string *)&(iso9660->utf16be).buffer_length,(size_t)pcVar6);
    if (paVar7 == (archive_string *)0x0) {
      archive_set_error((archive *)file_local,0xc,"Can\'t allocate memory for UTF-16BE");
      return -0x1e;
    }
    memcpy((void *)(iso9660->utf16be).buffer_length,(void *)u16len,(size_t)pcVar6);
    (iso9660->mbs).s = pcVar6;
  }
  pcVar6 = p;
  (iso9660->cur_dirstr).buffer_length = 0;
  paVar7 = &iso9660->cur_dirstr;
  if (p == (char *)0x0) {
    local_a0 = 0;
  }
  else {
    local_a0 = strlen(p);
  }
  archive_strncat((archive_string *)&paVar7->length,pcVar6,local_a0);
  uStack_50 = (iso9660->cur_dirstr).buffer_length;
  slash = (char *)(iso9660->cur_dirstr).length;
  dirname = slash;
  while (*dirname != '\0') {
    if (*dirname == '/') {
      dirname = dirname + 1;
      uStack_50 = uStack_50 - 1;
    }
    else {
      if (*dirname != '.') break;
      if ((dirname[1] == '.') && (dirname[2] == '/')) {
        dirname = dirname + 3;
        uStack_50 = uStack_50 - 3;
      }
      else if ((dirname[1] == '/') || ((dirname[1] == '.' && (dirname[2] == '\0')))) {
        dirname = dirname + 2;
        uStack_50 = uStack_50 - 2;
      }
      else {
        if (dirname[1] != '\0') break;
        dirname = dirname + 1;
        uStack_50 = uStack_50 - 1;
      }
    }
  }
  if (dirname != slash) {
    memmove(slash,dirname,uStack_50 + 1);
    dirname = slash;
  }
  do {
    uVar1 = uStack_50;
    if (uStack_50 == 0) break;
    if ((uStack_50 != 0) && (dirname[uStack_50 - 1] == '/')) {
      dirname[uStack_50 - 1] = '\0';
      uStack_50 = uStack_50 - 1;
    }
    if (((1 < uStack_50) && (dirname[uStack_50 - 2] == '/')) && (dirname[uStack_50 - 1] == '.')) {
      dirname[uStack_50 - 2] = '\0';
      uStack_50 = uStack_50 - 2;
    }
    if (((2 < uStack_50) && (dirname[uStack_50 - 3] == '/')) &&
       ((dirname[uStack_50 - 2] == '.' && (dirname[uStack_50 - 1] == '.')))) {
      dirname[uStack_50 - 3] = '\0';
      uStack_50 = uStack_50 - 3;
    }
  } while (uVar1 != uStack_50);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            pcVar6 = dirname;
            if (*dirname == '\0') {
              dirname = slash;
              uStack_50 = strlen(slash);
              mVar3 = archive_entry_filetype((archive_entry *)(iso9660->cur_dirstr).s);
              if (mVar3 == 0xa000) {
                pcVar6 = archive_entry_symlink((archive_entry *)(iso9660->cur_dirstr).s);
                iso9660->sconv_to_utf16be = (archive_string_conv *)0x0;
                paVar7 = &iso9660->mbs;
                p = pcVar6;
                if (pcVar6 == (char *)0x0) {
                  local_d8 = 0;
                }
                else {
                  local_d8 = strlen(pcVar6);
                }
                archive_strncat((archive_string *)&paVar7->buffer_length,pcVar6,local_d8);
              }
              len = 0;
              *(undefined4 *)&(iso9660->all_file_list).first = 0;
              for (; *dirname != '\0'; dirname = dirname + 1) {
                if (*dirname == '/') {
                  len = (size_t)dirname;
                  *(int *)&(iso9660->all_file_list).first =
                       *(int *)&(iso9660->all_file_list).first + 1;
                }
              }
              if (len == 0) {
                (iso9660->cur_dirstr).buffer_length = uStack_50;
                (iso9660->utf16be).s = (char *)0x0;
                archive_string_concat
                          ((archive_string *)&iso9660->need_multi_extent,
                           (archive_string *)&(iso9660->cur_dirstr).length);
                (iso9660->cur_dirstr).buffer_length = 0;
                *(undefined1 *)(iso9660->cur_dirstr).length = 0;
                a_local._4_4_ = u16._4_4_;
              }
              else {
                *(undefined1 *)len = 0;
                (iso9660->cur_dirstr).buffer_length = len - (long)slash;
                (iso9660->utf16be).s = (char *)0x0;
                piVar5 = &iso9660->need_multi_extent;
                _p = (void *)(len + 1);
                if (len == 0xffffffffffffffff) {
                  local_f0 = 0;
                }
                else {
                  local_f0 = strlen((char *)(len + 1));
                }
                archive_strncat((archive_string *)piVar5,_p,local_f0);
                mVar3 = archive_entry_filetype((archive_entry *)(iso9660->cur_dirstr).s);
                if (mVar3 == 0x4000) {
                  *(int *)&(iso9660->all_file_list).first =
                       *(int *)&(iso9660->all_file_list).first + 1;
                }
                a_local._4_4_ = u16._4_4_;
              }
              return a_local._4_4_;
            }
            if (*dirname == '/') break;
            dirname = dirname + 1;
          }
          if (dirname[1] != '/') break;
          pcVar8 = dirname + 1;
          sVar9 = strlen(dirname + 1);
          memmove(pcVar6,pcVar8,sVar9 + 1);
        }
        if ((dirname[1] != '.') || (dirname[2] != '/')) break;
        pcVar8 = dirname + 2;
        sVar9 = strlen(dirname + 2);
        memmove(pcVar6,pcVar8,sVar9 + 1);
      }
      if ((dirname[1] == '.') && ((dirname[2] == '.' && (local_88 = dirname, dirname[3] == '/'))))
      break;
      dirname = dirname + 1;
    }
    do {
      local_88 = local_88 + -1;
      if (local_88 < slash) break;
    } while (*local_88 != '/');
    if (slash < local_88) {
      strcpy(local_88,dirname + 3);
      dirname = local_88;
    }
    else {
      strcpy(slash,dirname + 4);
      dirname = slash;
    }
  } while( true );
}

Assistant:

static int
isofile_gen_utility_names(struct archive_write *a, struct isofile *file)
{
	struct iso9660 *iso9660;
	const char *pathname;
	char *p, *dirname, *slash;
	size_t len;
	int ret = ARCHIVE_OK;

	iso9660 = a->format_data;

	archive_string_empty(&(file->parentdir));
	archive_string_empty(&(file->basename));
	archive_string_empty(&(file->basename_utf16));
	archive_string_empty(&(file->symlink));

	pathname =  archive_entry_pathname(file->entry);
	if (pathname == NULL || pathname[0] == '\0') {/* virtual root */
		file->dircnt = 0;
		return (ret);
	}

	/*
	 * Make a UTF-16BE basename if Joliet extension enabled.
	 */
	if (iso9660->opt.joliet) {
		const char *u16, *ulast;
		size_t u16len, ulen_last;

		if (iso9660->sconv_to_utf16be == NULL) {
			iso9660->sconv_to_utf16be =
			    archive_string_conversion_to_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_to_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
			iso9660->sconv_from_utf16be =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_from_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
		}

		/*
		 * Convert a filename to UTF-16BE.
		 */
		if (0 > archive_entry_pathname_l(file->entry, &u16, &u16len,
		    iso9660->sconv_to_utf16be)) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for UTF-16BE");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "A filename cannot be converted to UTF-16BE;"
			    "You should disable making Joliet extension");
			ret = ARCHIVE_WARN;
		}

		/*
		 * Make sure a path separator is not in the last;
		 * Remove trailing '/'.
		 */
		while (u16len >= 2) {
#if defined(_WIN32) || defined(__CYGWIN__)
			if (u16[u16len-2] == 0 &&
			    (u16[u16len-1] == '/' || u16[u16len-1] == '\\'))
#else
			if (u16[u16len-2] == 0 && u16[u16len-1] == '/')
#endif
			{
				u16len -= 2;
			} else
				break;
		}

		/*
		 * Find a basename in UTF-16BE.
		 */
		ulast = u16;
		u16len >>= 1;
		ulen_last = u16len;
		while (u16len > 0) {
#if defined(_WIN32) || defined(__CYGWIN__)
			if (u16[0] == 0 && (u16[1] == '/' || u16[1] == '\\'))
#else
			if (u16[0] == 0 && u16[1] == '/')
#endif
			{
				ulast = u16 + 2;
				ulen_last = u16len -1;
			}
			u16 += 2;
			u16len --;
		}
		ulen_last <<= 1;
		if (archive_string_ensure(&(file->basename_utf16),
		    ulen_last) == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}

		/*
		 * Set UTF-16BE basename.
		 */
		memcpy(file->basename_utf16.s, ulast, ulen_last);
		file->basename_utf16.length = ulen_last;
	}

	archive_strcpy(&(file->parentdir), pathname);
#if defined(_WIN32) || defined(__CYGWIN__)
	/*
	 * Convert a path-separator from '\' to  '/'
	 */
	if (cleanup_backslash_1(file->parentdir.s) != 0) {
		const wchar_t *wp = archive_entry_pathname_w(file->entry);
		struct archive_wstring ws;

		if (wp != NULL) {
			int r;
			archive_string_init(&ws);
			archive_wstrcpy(&ws, wp);
			cleanup_backslash_2(ws.s);
			archive_string_empty(&(file->parentdir));
			r = archive_string_append_from_wcs(&(file->parentdir),
			    ws.s, ws.length);
			archive_wstring_free(&ws);
			if (r < 0 && errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				return (ARCHIVE_FATAL);
			}
		}
	}
#endif

	len = file->parentdir.length;
	p = dirname = file->parentdir.s;

	/*
	 * Remove leading '/', '../' and './' elements
	 */
	while (*p) {
		if (p[0] == '/') {
			p++;
			len--;
		} else if (p[0] != '.')
			break;
		else if (p[1] == '.' && p[2] == '/') {
			p += 3;
			len -= 3;
		} else if (p[1] == '/' || (p[1] == '.' && p[2] == '\0')) {
			p += 2;
			len -= 2;
		} else if (p[1] == '\0') {
			p++;
			len--;
		} else
			break;
	}
	if (p != dirname) {
		memmove(dirname, p, len+1);
		p = dirname;
	}
	/*
	 * Remove "/","/." and "/.." elements from tail.
	 */
	while (len > 0) {
		size_t ll = len;

		if (len > 0 && p[len-1] == '/') {
			p[len-1] = '\0';
			len--;
		}
		if (len > 1 && p[len-2] == '/' && p[len-1] == '.') {
			p[len-2] = '\0';
			len -= 2;
		}
		if (len > 2 && p[len-3] == '/' && p[len-2] == '.' &&
		    p[len-1] == '.') {
			p[len-3] = '\0';
			len -= 3;
		}
		if (ll == len)
			break;
	}
	while (*p) {
		if (p[0] == '/') {
			if (p[1] == '/')
				/* Convert '//' --> '/' */
				memmove(p, p+1, strlen(p+1) + 1);
			else if (p[1] == '.' && p[2] == '/')
				/* Convert '/./' --> '/' */
				memmove(p, p+2, strlen(p+2) + 1);
			else if (p[1] == '.' && p[2] == '.' && p[3] == '/') {
				/* Convert 'dir/dir1/../dir2/'
				 *     --> 'dir/dir2/'
				 */
				char *rp = p -1;
				while (rp >= dirname) {
					if (*rp == '/')
						break;
					--rp;
				}
				if (rp > dirname) {
					strcpy(rp, p+3);
					p = rp;
				} else {
					strcpy(dirname, p+4);
					p = dirname;
				}
			} else
				p++;
		} else
			p++;
	}
	p = dirname;
	len = strlen(p);

	if (archive_entry_filetype(file->entry) == AE_IFLNK) {
		/* Convert symlink name too. */
		pathname = archive_entry_symlink(file->entry);
		archive_strcpy(&(file->symlink),  pathname);
#if defined(_WIN32) || defined(__CYGWIN__)
		/*
		 * Convert a path-separator from '\' to  '/'
		 */
		if (archive_strlen(&(file->symlink)) > 0 &&
		    cleanup_backslash_1(file->symlink.s) != 0) {
			const wchar_t *wp =
			    archive_entry_symlink_w(file->entry);
			struct archive_wstring ws;

			if (wp != NULL) {
				int r;
				archive_string_init(&ws);
				archive_wstrcpy(&ws, wp);
				cleanup_backslash_2(ws.s);
				archive_string_empty(&(file->symlink));
				r = archive_string_append_from_wcs(
				    &(file->symlink),
				    ws.s, ws.length);
				archive_wstring_free(&ws);
				if (r < 0 && errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory");
					return (ARCHIVE_FATAL);
				}
			}
		}
#endif
	}
	/*
	 * - Count up directory elements.
	 * - Find out the position which points the last position of
	 *   path separator('/').
	 */
	slash = NULL;
	file->dircnt = 0;
	for (; *p != '\0'; p++)
		if (*p == '/') {
			slash = p;
			file->dircnt++;
		}
	if (slash == NULL) {
		/* The pathname doesn't have a parent directory. */
		file->parentdir.length = len;
		archive_string_copy(&(file->basename), &(file->parentdir));
		archive_string_empty(&(file->parentdir));
		*file->parentdir.s = '\0';
		return (ret);
	}

	/* Make a basename from dirname and slash */
	*slash  = '\0';
	file->parentdir.length = slash - dirname;
	archive_strcpy(&(file->basename),  slash + 1);
	if (archive_entry_filetype(file->entry) == AE_IFDIR)
		file->dircnt ++;
	return (ret);
}